

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  Type_Info *this;
  element_type *peVar1;
  element_type *peVar2;
  pointer pTVar3;
  pointer pTVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar10;
  Type_Info *ti;
  bool bVar11;
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_rhs;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_lhs;
  
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&dynamic_lhs);
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&dynamic_rhs);
  if (dynamic_lhs.
      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    bVar11 = true;
    if (dynamic_rhs.
        super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) goto LAB_00181510;
    peVar1 = (lhs->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    peVar2 = (rhs->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    uVar7 = ((long)(peVar1->m_types).
                   super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(peVar1->m_types).
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18;
    lVar8 = (long)(peVar2->m_types).
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(peVar2->m_types).
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar9 = lVar8 / 0x18;
    lVar8 = lVar8 % 0x18;
    if (function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
        ::boxed_type == '\0') {
      iVar6 = __cxa_guard_acquire(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                                   ::boxed_type,0x18,lVar8);
      lVar8 = extraout_RDX;
      if (iVar6 != 0) {
        function_less_than::boxed_type.m_type_info = (type_info *)&Boxed_Value::typeinfo;
        function_less_than::boxed_type.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
        function_less_than::boxed_type.m_flags = 0;
        __cxa_guard_release(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                             ::boxed_type);
        lVar8 = extraout_RDX_00;
      }
    }
    if (function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
        ::boxed_pod_type == '\0') {
      iVar6 = __cxa_guard_acquire(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                                   ::boxed_pod_type,0x18,lVar8);
      if (iVar6 != 0) {
        function_less_than::boxed_pod_type.m_type_info = (type_info *)&Boxed_Number::typeinfo;
        function_less_than::boxed_pod_type.m_bare_type_info = (type_info *)&Boxed_Number::typeinfo;
        function_less_than::boxed_pod_type.m_flags = 0;
        __cxa_guard_release(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                             ::boxed_pod_type);
      }
    }
    if (uVar7 < uVar9) {
      uVar9 = uVar7;
    }
    uVar7 = 0;
    lVar8 = 0x18;
    do {
      lVar10 = lVar8;
      uVar7 = uVar7 + 1;
      if (uVar9 <= uVar7) goto LAB_0018150e;
      pTVar3 = (peVar1->m_types).
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this = (Type_Info *)((long)&pTVar3->m_type_info + lVar10);
      pTVar4 = (peVar2->m_types).
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ti = (Type_Info *)((long)&pTVar4->m_type_info + lVar10);
      bVar11 = Type_Info::bare_equal(this,ti);
    } while ((bVar11) &&
            (lVar8 = lVar10 + 0x18,
            (*(byte *)((long)&pTVar3->m_flags + lVar10) & 1) ==
            (*(byte *)((long)&pTVar4->m_flags + lVar10) & 1)));
    bVar11 = Type_Info::bare_equal(this,ti);
    if ((!bVar11) ||
       (((*(byte *)((long)&pTVar3->m_flags + lVar10) & 1) == 0 ||
        ((*(byte *)((long)&pTVar4->m_flags + lVar10) & 1) != 0)))) {
      bVar11 = Type_Info::bare_equal(this,ti);
      if ((bVar11) && ((*(byte *)((long)&pTVar3->m_flags + lVar10) & 1) == 0)) {
        bVar11 = true;
        goto LAB_00181510;
      }
      bVar11 = Type_Info::bare_equal(this,&function_less_than::boxed_type);
      if (!bVar11) {
        bVar11 = Type_Info::bare_equal(ti,&function_less_than::boxed_type);
        bVar5 = Type_Info::bare_equal(this,&function_less_than::boxed_pod_type);
        if ((!bVar11) && (!bVar5)) {
          bVar5 = Type_Info::bare_equal(ti,&function_less_than::boxed_pod_type);
          bVar11 = true;
          if (!bVar5) {
            bVar11 = this->m_type_info < ti->m_type_info;
          }
        }
        goto LAB_00181510;
      }
    }
  }
  else if (dynamic_rhs.
           super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != (element_type *)0x0) {
    std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_60,
                 &((dynamic_lhs.
                    super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->m_guard).
                  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                );
    peVar1 = local_60._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    if (peVar1 != (element_type *)0x0) {
      std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_60,
                   &((dynamic_rhs.
                      super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->m_guard).
                    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                  );
      bVar11 = local_60._M_ptr == (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      goto LAB_00181510;
    }
  }
LAB_0018150e:
  bVar11 = false;
LAB_00181510:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dynamic_rhs.
              super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dynamic_lhs.
              super___shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar11;
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs)
        {

          auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
          auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

          if (dynamic_lhs && dynamic_rhs)
          {
            if (dynamic_lhs->get_guard())
            {
              return dynamic_rhs->get_guard() ? false : true;
            } else {
              return false;
            }
          }

          if (dynamic_lhs && !dynamic_rhs)
          {
            return false;
          }

          if (!dynamic_lhs && dynamic_rhs)
          {
            return true;
          }

          const auto &lhsparamtypes = lhs->get_param_types();
          const auto &rhsparamtypes = rhs->get_param_types();

          const auto lhssize = lhsparamtypes.size();
          const auto rhssize = rhsparamtypes.size();

#ifdef CHAISCRIPT_HAS_MAGIC_STATICS
          static auto boxed_type = user_type<Boxed_Value>();
          static auto boxed_pod_type = user_type<Boxed_Number>();
#else
          auto boxed_type = user_type<Boxed_Value>();
          auto boxed_pod_type = user_type<Boxed_Number>();
#endif

          for (size_t i = 1; i < lhssize && i < rhssize; ++i)
          {
            const Type_Info &lt = lhsparamtypes[i];
            const Type_Info &rt = rhsparamtypes[i];

            if (lt.bare_equal(rt) && lt.is_const() == rt.is_const())
            {
              continue; // The first two types are essentially the same, next iteration
            }

            // const is after non-const for the same type
            if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const())
            {
              return false;
            }

            if (lt.bare_equal(rt) && !lt.is_const())
            {
              return true;
            }

            // boxed_values are sorted last
            if (lt.bare_equal(boxed_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_type))
            {
              if (lt.bare_equal(boxed_pod_type))
              {
                return true;
              }
              return true;
            }

            if (lt.bare_equal(boxed_pod_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_pod_type))
            {
              return true;
            }

            // otherwise, we want to sort by typeid
            return lt < rt;
          }

          return false;
        }